

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  secp256k1_scalar *in_RSI;
  ulong *in_RDI;
  uint128_t t;
  uint64_t nonzero;
  
  iVar2 = secp256k1_scalar_is_zero(in_RSI);
  uVar1 = -(ulong)(iVar2 == 0);
  uVar3 = (ulong)(0x402da1732fc9bebd < ~in_RSI->d[0]);
  *in_RDI = ~in_RSI->d[0] + 0xbfd25e8cd0364142 & uVar1;
  uVar5 = ~in_RSI->d[1] + uVar3;
  uVar4 = (ulong)CARRY8(~in_RSI->d[1],uVar3) + (ulong)(0x4551231950b75fc4 < uVar5);
  in_RDI[1] = uVar5 + 0xbaaedce6af48a03b & uVar1;
  uVar3 = in_RSI->d[2];
  uVar5 = ~uVar3 + uVar4;
  in_RDI[2] = uVar5 - 2 & uVar1;
  in_RDI[3] = (~in_RSI->d[3] + (ulong)CARRY8(~uVar3,uVar4) + (ulong)(1 < uVar5)) - 1 & uVar1;
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    uint64_t nonzero = 0xFFFFFFFFFFFFFFFFULL * (secp256k1_scalar_is_zero(a) == 0);
    uint128_t t = (uint128_t)(~a->d[0]) + SECP256K1_N_0 + 1;
    r->d[0] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[1]) + SECP256K1_N_1;
    r->d[1] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[2]) + SECP256K1_N_2;
    r->d[2] = t & nonzero; t >>= 64;
    t += (uint128_t)(~a->d[3]) + SECP256K1_N_3;
    r->d[3] = t & nonzero;
}